

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

HighsInt __thiscall HFactor::build(HFactor *this,HighsTimerClock *factor_timer_clock_pointer)

{
  RefactorInfo *this_00;
  int iVar1;
  HighsInt HVar2;
  int iVar3;
  HighsTimer build_timer;
  
  HighsTimer::HighsTimer(&build_timer);
  this->build_timer_ = &build_timer;
  HighsTimer::start(&build_timer,0);
  if ((this->refactor_info_).use == true) {
    if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x26]);
    }
    HVar2 = rebuild(this,factor_timer_clock_pointer);
    this->rank_deficiency = HVar2;
    if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
      HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                       (factor_timer_clock_pointer->clock_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[0x26]);
    }
    if (this->rank_deficiency == 0) {
      HVar2 = 0;
      goto LAB_0037071e;
    }
  }
  this_00 = &this->refactor_info_;
  RefactorInfo::clear(this_00);
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      *(factor_timer_clock_pointer->clock_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start);
  }
  this->build_synthetic_tick = 0.0;
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      (factor_timer_clock_pointer->clock_).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[1]);
  }
  buildSimple(this);
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                     (factor_timer_clock_pointer->clock_).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[1]);
    if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[2]);
    }
  }
  HVar2 = buildKernel(this);
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                     (factor_timer_clock_pointer->clock_).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[2]);
  }
  if (HVar2 == -1) {
    HVar2 = -1;
  }
  else {
    this->rank_deficiency = HVar2;
    iVar3 = this->num_row;
    iVar1 = this->num_basic;
    if (HVar2 != 0 || iVar1 < iVar3) {
      if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
        HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                          (factor_timer_clock_pointer->clock_).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[3]);
      }
      if (this->num_basic == this->num_row) {
        highsLogDev(&this->log_options,kWarning,"Rank deficiency of %d identified in basis matrix\n"
                    ,(ulong)(uint)this->rank_deficiency);
      }
      buildHandleRankDeficiency(this);
      buildMarkSingC(this);
      if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
        HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                         (factor_timer_clock_pointer->clock_).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[3]);
      }
    }
    if (iVar1 < iVar3) {
      RefactorInfo::clear(this_00);
      HVar2 = (this->rank_deficiency - this->num_row) + this->num_basic;
    }
    else {
      if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
        HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                          (factor_timer_clock_pointer->clock_).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[4]);
      }
      buildFinish(this);
      if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
        HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                         (factor_timer_clock_pointer->clock_).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[4]);
      }
      if (this->rank_deficiency == 0) {
        (this->refactor_info_).build_synthetic_tick = this->build_synthetic_tick;
      }
      else {
        RefactorInfo::clear(this_00);
      }
      iVar3 = this->num_row;
      iVar3 = (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] + iVar3 +
              (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(long)iVar3 + -1];
      this->invert_num_el = iVar3;
      this->kernel_dim = this->kernel_dim - this->rank_deficiency;
      debugLogRankDeficiency
                (this->highs_debug_level,&this->log_options,this->rank_deficiency,
                 this->basis_matrix_num_el,iVar3,&this->kernel_dim,this->kernel_num_el,this->nwork);
      if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
        HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                         *(factor_timer_clock_pointer->clock_).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
      }
      HVar2 = this->rank_deficiency;
    }
  }
LAB_0037071e:
  HighsTimer::~HighsTimer(&build_timer);
  return HVar2;
}

Assistant:

HighsInt HFactor::build(HighsTimerClock* factor_timer_clock_pointer) {
  // Set up a timer to prevent build running longer than time_limit_,
  // which is kHighsInf by default, and only set to a finite value in
  // HPresolve::removeDependentEquations
  HighsTimer build_timer;
  build_timer_ = &build_timer;
  build_timer.start();

  const bool report_lu = false;
  // Ensure that the A matrix is valid for factorization
  assert(this->a_matrix_valid);
  FactorTimer factor_timer;
  // Possibly use the refactorization information!
  if (refactor_info_.use) {
    factor_timer.start(FactorReinvert, factor_timer_clock_pointer);
    rank_deficiency = rebuild(factor_timer_clock_pointer);
    factor_timer.stop(FactorReinvert, factor_timer_clock_pointer);
    if (!rank_deficiency) return 0;
  }
  // Refactoring from just the list of basic variables. Initialise the
  // refactorization information.
  refactor_info_.clear();
  // Start the timer
  factor_timer.start(FactorInvert, factor_timer_clock_pointer);
  build_synthetic_tick = 0;
  factor_timer.start(FactorInvertSimple, factor_timer_clock_pointer);
  // Build the L, U factor
  buildSimple();
  if (report_lu) {
    printf("\nAfter units and singletons\n");
    reportLu(kReportLuBoth, false);
  }
  factor_timer.stop(FactorInvertSimple, factor_timer_clock_pointer);
  factor_timer.start(FactorInvertKernel, factor_timer_clock_pointer);
  const HighsInt build_kernel_return = buildKernel();
  factor_timer.stop(FactorInvertKernel, factor_timer_clock_pointer);
  //
  // build_kernel_return of kBuildKernelReturnTimeout (<0) indicates
  // that time limit has been reached, otherwise it's the rank
  // deficiency of the basic variables. If num_basic < num_row, then
  // have to identify the logicals required to complete the basis by
  // continuing as if a full-dimension set of basic variables was rank
  // deficient.
  if (build_kernel_return == kBuildKernelReturnTimeout)
    return kBuildKernelReturnTimeout;
  rank_deficiency = build_kernel_return;
  const bool incomplete_basis = num_basic < num_row;
  if (rank_deficiency || incomplete_basis) {
    factor_timer.start(FactorInvertDeficient, factor_timer_clock_pointer);
    if (num_basic == num_row)
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Rank deficiency of %" HIGHSINT_FORMAT
                  " identified in basis matrix\n",
                  rank_deficiency);
    // Singular matrix B: reorder the basic variables so that the
    // singular columns are in the position corresponding to the
    // logical which replaces them
    buildHandleRankDeficiency();
    buildMarkSingC();
    factor_timer.stop(FactorInvertDeficient, factor_timer_clock_pointer);
  }
  if (incomplete_basis) {
    // Completing the factorization is not relevant if the basis
    // matrix is incomplete, so clear any refactorization information
    // and return
    this->refactor_info_.clear();
    assert(!this->refactor_info_.use);
    const HighsInt basic_index_rank_deficiency =
        rank_deficiency - (num_row - num_basic);
    return basic_index_rank_deficiency;
  }
  // Complete INVERT
  if (report_lu) {
    printf("\nFactored INVERT\n");
    reportLu(kReportLuBoth, false);
  }
  factor_timer.start(FactorInvertFinish, factor_timer_clock_pointer);
  buildFinish();
  factor_timer.stop(FactorInvertFinish, factor_timer_clock_pointer);
  //
  // Indicate that the refactorization information is known unless the basis was
  // rank deficient
  if (rank_deficiency) {
    this->refactor_info_.clear();
  } else {
    // Check that the refactorization information is not (yet) flagged
    // to be used in a future call
    assert(!this->refactor_info_.use);
    // Record build_synthetic_tick to use as the value of
    // build_synthetic_tick if refactorization is performed. Not only
    // is there no build_synthetic_tick measure for refactorization,
    // if there were it would give an unrealistic underestimate of the
    // cost of factorization from scratch
    this->refactor_info_.build_synthetic_tick = this->build_synthetic_tick;
  }

  // Record the number of entries in the INVERT
  invert_num_el = l_start[num_row] + u_last_p[num_row - 1] + num_row;

  kernel_dim -= rank_deficiency;
  debugLogRankDeficiency(highs_debug_level, log_options, rank_deficiency,
                         basis_matrix_num_el, invert_num_el, kernel_dim,
                         kernel_num_el, nwork);
  factor_timer.stop(FactorInvert, factor_timer_clock_pointer);
  return rank_deficiency;
}